

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O1

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTWhere *where)

{
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<VisitorResult> sVar2;
  shared_ptr<LogicalOperation> lop;
  undefined1 local_31;
  ASTVisitor local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  shared_ptr<LogicalOperation> local_20;
  
  (**(code **)**(undefined8 **)(in_RDX + 8))(&local_30,*(undefined8 **)(in_RDX + 8),where);
  local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._vptr_ASTVisitor;
  local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_30._vptr_ASTVisitor = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<LogicalFilter,std::allocator<LogicalFilter>,std::shared_ptr<LogicalOperation>&>
            (&local_28,(LogicalFilter **)&local_30,(allocator<LogicalFilter> *)&local_31,&local_20);
  _Var1._M_pi = local_28._M_pi;
  (this->super_ASTVisitor)._vptr_ASTVisitor = local_30._vptr_ASTVisitor;
  this[1].super_ASTVisitor._vptr_ASTVisitor = (_func_int **)0x0;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this[1].super_ASTVisitor._vptr_ASTVisitor = (_func_int **)_Var1._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTWhere *where) override {
        auto lop = std::static_pointer_cast<LogicalOperation>(where->getFilterOperation()->accept(this));
        return std::make_shared<LogicalFilter>(lop);
    }